

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O0

void Hacl_Bignum256_32_mul(uint32_t *a,uint32_t *b,uint32_t *res)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t r_7;
  uint32_t *res_i_15;
  uint32_t a_i2_15;
  uint32_t *res_i2_15;
  uint32_t a_i1_15;
  uint32_t *res_i1_15;
  uint32_t a_i0_15;
  uint32_t *res_i0_15;
  uint32_t a_i_15;
  uint32_t *res_i_14;
  uint32_t a_i2_14;
  uint32_t *res_i2_14;
  uint32_t a_i1_14;
  uint32_t *res_i1_14;
  uint32_t a_i0_14;
  uint32_t *res_i0_14;
  uint32_t a_i_14;
  uint32_t i_7;
  uint32_t c_7;
  uint32_t *res_j_7;
  uint32_t bj_7;
  uint32_t r_6;
  uint32_t *res_i_13;
  uint32_t a_i2_13;
  uint32_t *res_i2_13;
  uint32_t a_i1_13;
  uint32_t *res_i1_13;
  uint32_t a_i0_13;
  uint32_t *res_i0_13;
  uint32_t a_i_13;
  uint32_t *res_i_12;
  uint32_t a_i2_12;
  uint32_t *res_i2_12;
  uint32_t a_i1_12;
  uint32_t *res_i1_12;
  uint32_t a_i0_12;
  uint32_t *res_i0_12;
  uint32_t a_i_12;
  uint32_t i_6;
  uint32_t c_6;
  uint32_t *res_j_6;
  uint32_t bj_6;
  uint32_t r_5;
  uint32_t *res_i_11;
  uint32_t a_i2_11;
  uint32_t *res_i2_11;
  uint32_t a_i1_11;
  uint32_t *res_i1_11;
  uint32_t a_i0_11;
  uint32_t *res_i0_11;
  uint32_t a_i_11;
  uint32_t *res_i_10;
  uint32_t a_i2_10;
  uint32_t *res_i2_10;
  uint32_t a_i1_10;
  uint32_t *res_i1_10;
  uint32_t a_i0_10;
  uint32_t *res_i0_10;
  uint32_t a_i_10;
  uint32_t i_5;
  uint32_t c_5;
  uint32_t *res_j_5;
  uint32_t bj_5;
  uint32_t r_4;
  uint32_t *res_i_9;
  uint32_t a_i2_9;
  uint32_t *res_i2_9;
  uint32_t a_i1_9;
  uint32_t *res_i1_9;
  uint32_t a_i0_9;
  uint32_t *res_i0_9;
  uint32_t a_i_9;
  uint32_t *res_i_8;
  uint32_t a_i2_8;
  uint32_t *res_i2_8;
  uint32_t a_i1_8;
  uint32_t *res_i1_8;
  uint32_t a_i0_8;
  uint32_t *res_i0_8;
  uint32_t a_i_8;
  uint32_t i_4;
  uint32_t c_4;
  uint32_t *res_j_4;
  uint32_t bj_4;
  uint32_t r_3;
  uint32_t *res_i_7;
  uint32_t a_i2_7;
  uint32_t *res_i2_7;
  uint32_t a_i1_7;
  uint32_t *res_i1_7;
  uint32_t a_i0_7;
  uint32_t *res_i0_7;
  uint32_t a_i_7;
  uint32_t *res_i_6;
  uint32_t a_i2_6;
  uint32_t *res_i2_6;
  uint32_t a_i1_6;
  uint32_t *res_i1_6;
  uint32_t a_i0_6;
  uint32_t *res_i0_6;
  uint32_t a_i_6;
  uint32_t i_3;
  uint32_t c_3;
  uint32_t *res_j_3;
  uint32_t bj_3;
  uint32_t r_2;
  uint32_t *res_i_5;
  uint32_t a_i2_5;
  uint32_t *res_i2_5;
  uint32_t a_i1_5;
  uint32_t *res_i1_5;
  uint32_t a_i0_5;
  uint32_t *res_i0_5;
  uint32_t a_i_5;
  uint32_t *res_i_4;
  uint32_t a_i2_4;
  uint32_t *res_i2_4;
  uint32_t a_i1_4;
  uint32_t *res_i1_4;
  uint32_t a_i0_4;
  uint32_t *res_i0_4;
  uint32_t a_i_4;
  uint32_t i_2;
  uint32_t c_2;
  uint32_t *res_j_2;
  uint32_t bj_2;
  uint32_t r_1;
  uint32_t *res_i_3;
  uint32_t a_i2_3;
  uint32_t *res_i2_3;
  uint32_t a_i1_3;
  uint32_t *res_i1_3;
  uint32_t a_i0_3;
  uint32_t *res_i0_3;
  uint32_t a_i_3;
  uint32_t *res_i_2;
  uint32_t a_i2_2;
  uint32_t *res_i2_2;
  uint32_t a_i1_2;
  uint32_t *res_i1_2;
  uint32_t a_i0_2;
  uint32_t *res_i0_2;
  uint32_t a_i_2;
  uint32_t i_1;
  uint32_t c_1;
  uint32_t *res_j_1;
  uint32_t bj_1;
  uint32_t r;
  uint32_t *res_i_1;
  uint32_t a_i2_1;
  uint32_t *res_i2_1;
  uint32_t a_i1_1;
  uint32_t *res_i1_1;
  uint32_t a_i0_1;
  uint32_t *res_i0_1;
  uint32_t a_i_1;
  uint32_t *res_i;
  uint32_t a_i2;
  uint32_t *res_i2;
  uint32_t a_i1;
  uint32_t *res_i1;
  uint32_t a_i0;
  uint32_t *res_i0;
  uint32_t a_i;
  uint32_t i;
  uint32_t c;
  uint32_t *res_j;
  uint32_t bj;
  uint32_t i0;
  uint32_t *res_local;
  uint32_t *b_local;
  uint32_t *a_local;
  
  memset(res,0,0x40);
  uVar2 = *b;
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(*a,uVar2,0,res);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[1],uVar2,uVar1,res + 1);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[2],uVar2,uVar1,res + 2);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[3],uVar2,uVar1,res + 3);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[4],uVar2,uVar1,res + 4);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[5],uVar2,uVar1,res + 5);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[6],uVar2,uVar1,res + 6);
  uVar2 = Hacl_Bignum_Base_mul_wide_add2_u32(a[7],uVar2,uVar1,res + 7);
  res[8] = uVar2;
  uVar2 = b[1];
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(*a,uVar2,0,res + 1);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[1],uVar2,uVar1,res + 2);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[2],uVar2,uVar1,res + 3);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[3],uVar2,uVar1,res + 4);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[4],uVar2,uVar1,res + 5);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[5],uVar2,uVar1,res + 6);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[6],uVar2,uVar1,res + 7);
  uVar2 = Hacl_Bignum_Base_mul_wide_add2_u32(a[7],uVar2,uVar1,res + 8);
  res[9] = uVar2;
  uVar2 = b[2];
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(*a,uVar2,0,res + 2);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[1],uVar2,uVar1,res + 3);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[2],uVar2,uVar1,res + 4);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[3],uVar2,uVar1,res + 5);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[4],uVar2,uVar1,res + 6);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[5],uVar2,uVar1,res + 7);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[6],uVar2,uVar1,res + 8);
  uVar2 = Hacl_Bignum_Base_mul_wide_add2_u32(a[7],uVar2,uVar1,res + 9);
  res[10] = uVar2;
  uVar2 = b[3];
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(*a,uVar2,0,res + 3);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[1],uVar2,uVar1,res + 4);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[2],uVar2,uVar1,res + 5);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[3],uVar2,uVar1,res + 6);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[4],uVar2,uVar1,res + 7);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[5],uVar2,uVar1,res + 8);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[6],uVar2,uVar1,res + 9);
  uVar2 = Hacl_Bignum_Base_mul_wide_add2_u32(a[7],uVar2,uVar1,res + 10);
  res[0xb] = uVar2;
  uVar2 = b[4];
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(*a,uVar2,0,res + 4);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[1],uVar2,uVar1,res + 5);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[2],uVar2,uVar1,res + 6);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[3],uVar2,uVar1,res + 7);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[4],uVar2,uVar1,res + 8);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[5],uVar2,uVar1,res + 9);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[6],uVar2,uVar1,res + 10);
  uVar2 = Hacl_Bignum_Base_mul_wide_add2_u32(a[7],uVar2,uVar1,res + 0xb);
  res[0xc] = uVar2;
  uVar2 = b[5];
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(*a,uVar2,0,res + 5);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[1],uVar2,uVar1,res + 6);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[2],uVar2,uVar1,res + 7);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[3],uVar2,uVar1,res + 8);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[4],uVar2,uVar1,res + 9);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[5],uVar2,uVar1,res + 10);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[6],uVar2,uVar1,res + 0xb);
  uVar2 = Hacl_Bignum_Base_mul_wide_add2_u32(a[7],uVar2,uVar1,res + 0xc);
  res[0xd] = uVar2;
  uVar2 = b[6];
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(*a,uVar2,0,res + 6);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[1],uVar2,uVar1,res + 7);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[2],uVar2,uVar1,res + 8);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[3],uVar2,uVar1,res + 9);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[4],uVar2,uVar1,res + 10);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[5],uVar2,uVar1,res + 0xb);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[6],uVar2,uVar1,res + 0xc);
  uVar2 = Hacl_Bignum_Base_mul_wide_add2_u32(a[7],uVar2,uVar1,res + 0xd);
  res[0xe] = uVar2;
  uVar2 = b[7];
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(*a,uVar2,0,res + 7);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[1],uVar2,uVar1,res + 8);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[2],uVar2,uVar1,res + 9);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[3],uVar2,uVar1,res + 10);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[4],uVar2,uVar1,res + 0xb);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[5],uVar2,uVar1,res + 0xc);
  uVar1 = Hacl_Bignum_Base_mul_wide_add2_u32(a[6],uVar2,uVar1,res + 0xd);
  uVar2 = Hacl_Bignum_Base_mul_wide_add2_u32(a[7],uVar2,uVar1,res + 0xe);
  res[0xf] = uVar2;
  return;
}

Assistant:

void Hacl_Bignum256_32_mul(uint32_t *a, uint32_t *b, uint32_t *res)
{
  memset(res, 0U, 16U * sizeof (uint32_t));
  KRML_MAYBE_FOR8(i0,
    0U,
    8U,
    1U,
    uint32_t bj = b[i0];
    uint32_t *res_j = res + i0;
    uint32_t c = 0U;
    KRML_MAYBE_FOR2(i,
      0U,
      2U,
      1U,
      uint32_t a_i = a[4U * i];
      uint32_t *res_i0 = res_j + 4U * i;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, bj, c, res_i0);
      uint32_t a_i0 = a[4U * i + 1U];
      uint32_t *res_i1 = res_j + 4U * i + 1U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i0, bj, c, res_i1);
      uint32_t a_i1 = a[4U * i + 2U];
      uint32_t *res_i2 = res_j + 4U * i + 2U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i1, bj, c, res_i2);
      uint32_t a_i2 = a[4U * i + 3U];
      uint32_t *res_i = res_j + 4U * i + 3U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i2, bj, c, res_i););
    uint32_t r = c;
    res[8U + i0] = r;);
}